

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

void __thiscall Fl_Table::cols(Fl_Table *this,int val)

{
  IntVector *this_00;
  uint uVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  this->_cols = val;
  this_00 = &this->_colwidths;
  uVar1 = (this->_colwidths)._size;
  lVar4 = (long)(int)uVar1;
  if (lVar4 == 0) {
    iVar3 = 0x50;
  }
  else {
    iVar3 = this_00->arr[(int)(uVar1 - 1)];
  }
  IntVector::size(this_00,val);
  piVar2 = this_00->arr;
  for (; lVar4 < val; lVar4 = lVar4 + 1) {
    piVar2[lVar4] = iVar3;
  }
  table_resized(this);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::cols(int val) {
  _cols = val;
  {
    int default_w = ( _colwidths.size() > 0 ) ? _colwidths[_colwidths.size()-1] : 80;
    int now_size = _colwidths.size();
    _colwidths.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _colwidths[now_size++] = default_w;	// fill new
    }
  }
  table_resized();
  redraw();
}